

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

int bigcomp(U *rv,char *s0,BCinfo *bc)

{
  char cVar1;
  uint uVar2;
  uint32 uVar3;
  int iVar4;
  Bigint *pBVar5;
  Bigint *pBVar6;
  Bigint *pBVar7;
  Bigint *pBVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Bigint *b;
  uint uVar13;
  int iVar14;
  uint uVar15;
  double dVar16;
  int local_48;
  uint local_44;
  uint32 local_40;
  int local_3c;
  char *local_38;
  
  uVar2 = bc->nd;
  local_3c = bc->nd0;
  uVar13 = bc->e0 + uVar2;
  pBVar5 = sd2b(rv,bc->scale,&local_48);
  if (pBVar5 == (Bigint *)0x0) {
    return -1;
  }
  uVar3 = pBVar5->x[0];
  local_38 = s0;
  pBVar5 = lshift(pBVar5,1);
  if (pBVar5 == (Bigint *)0x0) {
    return -1;
  }
  *(byte *)pBVar5->x = (byte)pBVar5->x[0] | 1;
  iVar10 = ~uVar13 + local_48;
  local_48 = iVar10;
  local_40 = uVar3;
  pBVar6 = (Bigint *)
           __ckd_malloc__(0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                          ,0x1a9);
  b = pBVar5;
  if (pBVar6 == (Bigint *)0x0) goto LAB_00116927;
  pBVar6->x[0] = 1;
  pBVar6->k = 1;
  pBVar6->maxwds = 2;
  pBVar6->sign = 0;
  pBVar6->wds = 1;
  if ((int)uVar13 < 1) {
    if ((int)uVar13 < 0) {
      pBVar5 = pow5mult(pBVar5,-uVar13);
      pBVar7 = pBVar6;
      pBVar8 = pBVar5;
      goto joined_r0x001167ad;
    }
  }
  else {
    pBVar7 = pow5mult(pBVar6,uVar13);
    pBVar6 = pBVar5;
    pBVar8 = pBVar7;
joined_r0x001167ad:
    b = pBVar6;
    pBVar6 = pBVar7;
    if (pBVar8 == (Bigint *)0x0) goto LAB_00116927;
  }
  b = pBVar6;
  iVar11 = -iVar10;
  iVar14 = 0;
  iVar4 = iVar14;
  if (iVar10 < 1) {
    iVar10 = iVar14;
    iVar4 = iVar11;
  }
  iVar11 = hi0bits(b->x[(long)b->wds + -1]);
  if (0 < iVar4) {
    iVar14 = iVar4;
  }
  uVar13 = (iVar11 - iVar14) + 0x1cU & 0x1f;
  if (((iVar10 + uVar13 != 0) && (pBVar5 = lshift(pBVar5,iVar10 + uVar13), pBVar5 == (Bigint *)0x0))
     || ((iVar10 = uVar13 + iVar4, pBVar6 = b, iVar10 != 0 && SCARRY4(uVar13,iVar4) == iVar10 < 0 &&
         (pBVar6 = lshift(b,iVar10), b = pBVar5, pBVar6 == (Bigint *)0x0)))) {
LAB_00116927:
    ckd_free(b);
    return -1;
  }
  b = pBVar6;
  iVar10 = b->wds;
  if (pBVar5->wds == iVar10) {
    lVar9 = (long)iVar10 * 4 + 0x1c;
    do {
      uVar15 = *(uint *)((long)b->x + lVar9 + -0x20);
      uVar12 = *(uint *)((long)pBVar5->x + lVar9 + -0x20);
      if (uVar12 != uVar15) {
        uVar13 = 0xffffffff;
        if (uVar15 <= uVar12) goto LAB_00116955;
        goto LAB_001168a4;
      }
      lVar9 = lVar9 + -4;
    } while (0x1c < lVar9);
    uVar13 = 0xffffffff;
LAB_00116955:
    ckd_free(pBVar5);
    if (b == (Bigint *)0x0) goto LAB_0011696a;
  }
  else {
    if (pBVar5->wds < iVar10) {
LAB_001168a4:
      local_44 = 1;
      if (1 < (int)uVar2) {
        local_44 = uVar2;
      }
      uVar15 = 0;
      do {
        pBVar5 = multadd(pBVar5,10,0);
        if (pBVar5 == (Bigint *)0x0) {
          if (b == (Bigint *)0x0) {
            return -1;
          }
          goto LAB_00116927;
        }
        uVar12 = uVar15 + 1;
        uVar13 = uVar12;
        if ((int)uVar15 < local_3c) {
          uVar13 = uVar15;
        }
        cVar1 = local_38[uVar13];
        iVar10 = quorem(pBVar5,b);
        uVar13 = (cVar1 - iVar10) - 0x30;
        if (uVar13 != 0) goto LAB_00116955;
        if ((pBVar5->x[0] == 0) && (pBVar5->wds == 1)) {
          uVar13 = (uint)((int)(uVar15 + 1) < (int)uVar2);
          goto LAB_00116955;
        }
        uVar15 = uVar12;
      } while (local_44 != uVar12);
      uVar13 = 0xffffffff;
      goto LAB_00116955;
    }
    ckd_free(pBVar5);
    uVar13 = 0xffffffff;
  }
  ckd_free(b);
LAB_0011696a:
  if ((int)uVar13 < 1) {
    if (uVar13 != 0) {
      return 0;
    }
    local_40 = local_40 & 1;
    if (local_40 == 0) {
      return 0;
    }
  }
  dVar16 = sulp(rv,(BCinfo *)(ulong)(uint)bc->scale);
  rv->d = dVar16 + rv->d;
  return 0;
}

Assistant:

static int
bigcomp(U *rv, const char *s0, BCinfo *bc)
{
    Bigint *b, *d;
    int b2, d2, dd, i, nd, nd0, odd, p2, p5;

    nd = bc->nd;
    nd0 = bc->nd0;
    p5 = nd + bc->e0;
    b = sd2b(rv, bc->scale, &p2);
    if (b == NULL)
        return -1;

    /* record whether the lsb of rv/2^(bc->scale) is odd:  in the exact halfway
       case, this is used for round to even. */
    odd = b->x[0] & 1;

    /* left shift b by 1 bit and or a 1 into the least significant bit;
       this gives us b * 2**p2 = rv/2^(bc->scale) + 0.5 ulp. */
    b = lshift(b, 1);
    if (b == NULL)
        return -1;
    b->x[0] |= 1;
    p2--;

    p2 -= p5;
    d = i2b(1);
    if (d == NULL) {
        Bfree(b);
        return -1;
    }
    /* Arrange for convenient computation of quotients:
     * shift left if necessary so divisor has 4 leading 0 bits.
     */
    if (p5 > 0) {
        d = pow5mult(d, p5);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }
    else if (p5 < 0) {
        b = pow5mult(b, -p5);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if (p2 > 0) {
        b2 = p2;
        d2 = 0;
    }
    else {
        b2 = 0;
        d2 = -p2;
    }
    i = dshift(d, d2);
    if ((b2 += i) > 0) {
        b = lshift(b, b2);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if ((d2 += i) > 0) {
        d = lshift(d, d2);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }

    /* Compare s0 with b/d: set dd to -1, 0, or 1 according as s0 < b/d, s0 ==
     * b/d, or s0 > b/d.  Here the digits of s0 are thought of as representing
     * a number in the range [0.1, 1). */
    if (cmp(b, d) >= 0)
        /* b/d >= 1 */
        dd = -1;
    else {
        i = 0;
        for(;;) {
            b = multadd(b, 10, 0);
            if (b == NULL) {
                Bfree(d);
                return -1;
            }
            dd = s0[i < nd0 ? i : i+1] - '0' - quorem(b, d);
            i++;

            if (dd)
                break;
            if (!b->x[0] && b->wds == 1) {
                /* b/d == 0 */
                dd = i < nd;
                break;
            }
            if (!(i < nd)) {
                /* b/d != 0, but digits of s0 exhausted */
                dd = -1;
                break;
            }
        }
    }
    Bfree(b);
    Bfree(d);
    if (dd > 0 || (dd == 0 && odd))
        dval(rv) += sulp(rv, bc);
    return 0;
}